

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrans_avx2.c
# Opt level: O0

void itrans_dct2_h16_w8_avx2(s16 *src,s16 *dst,int bit_depth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  uint uVar52;
  ushort uVar53;
  uint uVar54;
  int in_EDX;
  undefined8 *in_RSI;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  s16 tmp [128];
  __m128i min_val_1;
  __m128i max_val_1;
  __m128i zero;
  __m128i offset_1;
  __m128i t3_1;
  __m128i t2_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i eo1_1;
  __m128i eo0_1;
  __m128i ee1_1;
  __m128i ee0_1;
  __m128i o3_1;
  __m128i o2_1;
  __m128i o1_1;
  __m128i o0_1;
  __m128i e3_1;
  __m128i e2_1;
  __m128i e1_1;
  __m128i e0_1;
  __m128i s7_1;
  __m128i s6_1;
  __m128i s5_1;
  __m128i s4_1;
  __m128i s3_1;
  __m128i s2_1;
  __m128i s1_1;
  __m128i s0_1;
  __m128i coeff_p17_n42_1;
  __m128i coeff_p42_p17_1;
  __m128i coeff_p32_n32_1;
  __m128i coeff_p32_p32_1;
  __m128i coeff_p38_n44_1;
  __m128i coeff_p9_n25_1;
  __m128i coeff_p9_p38_1;
  __m128i coeff_p25_n44_1;
  __m128i coeff_n44_n25_1;
  __m128i coeff_p38_n9_1;
  __m128i coeff_p25_p9_1;
  __m128i coeff_p44_p38_1;
  __m256i min_val;
  __m256i max_val;
  int i_src7;
  int i_src6;
  int i_src5;
  int i_src4;
  int i_src3;
  int i_src2;
  int j;
  __m256i offset;
  __m256i d7;
  __m256i d6;
  __m256i d5;
  __m256i d4;
  __m256i d3;
  __m256i d2;
  __m256i d1;
  __m256i d0;
  __m256i t3;
  __m256i t2;
  __m256i t1;
  __m256i t0;
  __m256i eo1;
  __m256i eo0;
  __m256i ee1;
  __m256i ee0;
  __m256i o3;
  __m256i o2;
  __m256i o1;
  __m256i o0;
  __m256i e3;
  __m256i e2;
  __m256i e1;
  __m256i e0;
  __m128i ss3;
  __m128i ss2;
  __m128i ss1;
  __m128i ss0;
  __m128i s7;
  __m128i s6;
  __m128i s5;
  __m128i s4;
  __m128i s3;
  __m128i s2;
  __m128i s1;
  __m128i s0;
  __m256i coeff_p17_n42;
  __m256i coeff_p42_p17;
  __m256i coeff_p32_n32;
  __m256i coeff_p32_p32;
  __m256i coeff_p38_n44;
  __m256i coeff_p9_n25;
  __m256i coeff_p9_p38;
  __m256i coeff_p25_n44;
  __m256i coeff_n44_n25;
  __m256i coeff_p38_n9;
  __m256i coeff_p25_p9;
  __m256i coeff_p44_p38;
  undefined8 local_2d00 [4];
  undefined1 local_2ce0 [32];
  undefined1 local_2cc0 [32];
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [44];
  int local_2bf4;
  undefined8 *local_2bf0;
  int local_2904;
  undefined8 local_2860;
  undefined8 uStackY_2858;
  undefined8 uStackY_2850;
  undefined8 uStackY_2848;
  undefined8 local_2840;
  undefined8 uStackY_2838;
  undefined8 uStackY_2830;
  undefined8 uStackY_2828;
  undefined8 local_2820;
  undefined8 uStackY_2818;
  undefined8 uStackY_2810;
  undefined8 uStackY_2808;
  undefined8 local_2800;
  undefined8 uStackY_27f8;
  undefined8 uStackY_27f0;
  undefined8 uStackY_27e8;
  undefined8 local_25e0;
  undefined8 uStackY_25d8;
  undefined8 local_25c0;
  undefined8 uStackY_25b8;
  byte local_239c;
  char local_2398;
  undefined8 *local_2390;
  int in_stack_ffffffffffffe3fc;
  int in_stack_ffffffffffffe400;
  int in_stack_ffffffffffffe404;
  s16 *in_stack_ffffffffffffe408;
  int in_stack_ffffffffffffe414;
  s16 *in_stack_ffffffffffffe418;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  
  local_2bf4 = in_EDX;
  local_2bf0 = in_RSI;
  dct2_butterfly_h16_avx2
            (in_stack_ffffffffffffe418,in_stack_ffffffffffffe414,in_stack_ffffffffffffe408,
             in_stack_ffffffffffffe404,in_stack_ffffffffffffe400,in_stack_ffffffffffffe3fc);
  uVar54 = 0x14 - local_2bf4;
  local_2390 = local_2bf0;
  local_2398 = (char)uVar54;
  local_239c = (byte)local_2bf4;
  auVar1 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,2);
  auVar1 = vpinsrd_avx(auVar1,0x26002c,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x26002c),0x26002c,1);
  auVar2 = vpinsrd_avx(auVar2,0x26002c,2);
  auVar2 = vpinsrd_avx(auVar2,0x26002c,3);
  uStack_b90 = auVar2._0_8_;
  uStack_b88 = auVar2._8_8_;
  auVar2 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar2 = vpinsrd_avx(auVar2,0x90019,2);
  auVar2 = vpinsrd_avx(auVar2,0x90019,3);
  auVar3 = vpinsrd_avx(ZEXT416(0x90019),0x90019,1);
  auVar3 = vpinsrd_avx(auVar3,0x90019,2);
  auVar3 = vpinsrd_avx(auVar3,0x90019,3);
  uStack_bd0 = auVar3._0_8_;
  uStack_bc8 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar3 = vpinsrd_avx(auVar3,0xfff70026,2);
  auVar3 = vpinsrd_avx(auVar3,0xfff70026,3);
  auVar4 = vpinsrd_avx(ZEXT416(0xfff70026),0xfff70026,1);
  auVar4 = vpinsrd_avx(auVar4,0xfff70026,2);
  auVar4 = vpinsrd_avx(auVar4,0xfff70026,3);
  uStack_c10 = auVar4._0_8_;
  uStack_c08 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar4 = vpinsrd_avx(auVar4,0xffe7ffd4,2);
  auVar4 = vpinsrd_avx(auVar4,0xffe7ffd4,3);
  auVar5 = vpinsrd_avx(ZEXT416(0xffe7ffd4),0xffe7ffd4,1);
  auVar5 = vpinsrd_avx(auVar5,0xffe7ffd4,2);
  auVar5 = vpinsrd_avx(auVar5,0xffe7ffd4,3);
  uStack_c50 = auVar5._0_8_;
  uStack_c48 = auVar5._8_8_;
  auVar5 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar5 = vpinsrd_avx(auVar5,0xffd40019,2);
  auVar5 = vpinsrd_avx(auVar5,0xffd40019,3);
  auVar6 = vpinsrd_avx(ZEXT416(0xffd40019),0xffd40019,1);
  auVar6 = vpinsrd_avx(auVar6,0xffd40019,2);
  auVar6 = vpinsrd_avx(auVar6,0xffd40019,3);
  uStack_c90 = auVar6._0_8_;
  uStack_c88 = auVar6._8_8_;
  auVar6 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar6 = vpinsrd_avx(auVar6,0x260009,2);
  auVar6 = vpinsrd_avx(auVar6,0x260009,3);
  auVar7 = vpinsrd_avx(ZEXT416(0x260009),0x260009,1);
  auVar7 = vpinsrd_avx(auVar7,0x260009,2);
  auVar7 = vpinsrd_avx(auVar7,0x260009,3);
  uStack_cd0 = auVar7._0_8_;
  uStack_cc8 = auVar7._8_8_;
  auVar7 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar7 = vpinsrd_avx(auVar7,0xffe70009,2);
  auVar7 = vpinsrd_avx(auVar7,0xffe70009,3);
  auVar8 = vpinsrd_avx(ZEXT416(0xffe70009),0xffe70009,1);
  auVar8 = vpinsrd_avx(auVar8,0xffe70009,2);
  auVar8 = vpinsrd_avx(auVar8,0xffe70009,3);
  uStack_d10 = auVar8._0_8_;
  uStack_d08 = auVar8._8_8_;
  auVar8 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar8 = vpinsrd_avx(auVar8,0xffd40026,2);
  auVar8 = vpinsrd_avx(auVar8,0xffd40026,3);
  auVar9 = vpinsrd_avx(ZEXT416(0xffd40026),0xffd40026,1);
  auVar9 = vpinsrd_avx(auVar9,0xffd40026,2);
  auVar9 = vpinsrd_avx(auVar9,0xffd40026,3);
  uStack_d50 = auVar9._0_8_;
  uStack_d48 = auVar9._8_8_;
  auVar9 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar9 = vpinsrd_avx(auVar9,0x200020,2);
  auVar9 = vpinsrd_avx(auVar9,0x200020,3);
  auVar10 = vpinsrd_avx(ZEXT416(0x200020),0x200020,1);
  auVar10 = vpinsrd_avx(auVar10,0x200020,2);
  auVar10 = vpinsrd_avx(auVar10,0x200020,3);
  uStack_d90 = auVar10._0_8_;
  uStack_d88 = auVar10._8_8_;
  auVar10 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar10 = vpinsrd_avx(auVar10,0xffe00020,2);
  auVar10 = vpinsrd_avx(auVar10,0xffe00020,3);
  auVar11 = vpinsrd_avx(ZEXT416(0xffe00020),0xffe00020,1);
  auVar11 = vpinsrd_avx(auVar11,0xffe00020,2);
  auVar11 = vpinsrd_avx(auVar11,0xffe00020,3);
  uStack_dd0 = auVar11._0_8_;
  uStack_dc8 = auVar11._8_8_;
  auVar11 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar11 = vpinsrd_avx(auVar11,0x11002a,2);
  auVar11 = vpinsrd_avx(auVar11,0x11002a,3);
  auVar12 = vpinsrd_avx(ZEXT416(0x11002a),0x11002a,1);
  auVar12 = vpinsrd_avx(auVar12,0x11002a,2);
  auVar12 = vpinsrd_avx(auVar12,0x11002a,3);
  uStack_e10 = auVar12._0_8_;
  uStack_e08 = auVar12._8_8_;
  auVar12 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar12 = vpinsrd_avx(auVar12,0xffd60011,2);
  auVar12 = vpinsrd_avx(auVar12,0xffd60011,3);
  auVar57 = vpinsrd_avx(ZEXT416(0xffd60011),0xffd60011,1);
  auVar57 = vpinsrd_avx(auVar57,0xffd60011,2);
  auVar57 = vpinsrd_avx(auVar57,0xffd60011,3);
  uStack_e50 = auVar57._0_8_;
  uStack_e48 = auVar57._8_8_;
  uVar52 = 1 << (local_2398 - 1U & 0x1f);
  auVar57 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar57 = vpinsrd_avx(auVar57,uVar52,2);
  auVar57 = vpinsrd_avx(auVar57,uVar52,3);
  auVar55 = vpinsrd_avx(ZEXT416(uVar52),uVar52,1);
  auVar55 = vpinsrd_avx(auVar55,uVar52,2);
  auVar55 = vpinsrd_avx(auVar55,uVar52,3);
  auVar55 = ZEXT116(0) * auVar57 + ZEXT116(1) * auVar55;
  auVar57 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar57;
  uStack_e90 = auVar57._0_8_;
  uStack_e88 = auVar57._8_8_;
  for (local_2904 = 0; local_2904 < 0x10; local_2904 = local_2904 + 8) {
    auVar56 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_2ce0 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2ca0 + (long)local_2904 * 2));
    auVar57 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_2ce0 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2ca0 + (long)local_2904 * 2));
    auVar13 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_2c60 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2c20 + (long)local_2904 * 2));
    auVar58 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_2c60 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2c20 + (long)local_2904 * 2));
    local_25c0 = auVar57._0_8_;
    uStackY_25b8 = auVar57._8_8_;
    local_25e0 = auVar58._0_8_;
    uStackY_25d8 = auVar58._8_8_;
    auVar39._16_8_ = local_25c0;
    auVar39._0_16_ = auVar56;
    auVar39._24_8_ = uStackY_25b8;
    auVar14._16_8_ = uStack_b90;
    auVar14._0_16_ = auVar1;
    auVar14._24_8_ = uStack_b88;
    auVar14 = vpmaddwd_avx2(auVar39,auVar14);
    auVar38._16_8_ = local_25e0;
    auVar38._0_16_ = auVar13;
    auVar38._24_8_ = uStackY_25d8;
    auVar15._16_8_ = uStack_bd0;
    auVar15._0_16_ = auVar2;
    auVar15._24_8_ = uStack_bc8;
    auVar15 = vpmaddwd_avx2(auVar38,auVar15);
    auVar37._16_8_ = local_25c0;
    auVar37._0_16_ = auVar56;
    auVar37._24_8_ = uStackY_25b8;
    auVar36._16_8_ = uStack_c10;
    auVar36._0_16_ = auVar3;
    auVar36._24_8_ = uStack_c08;
    auVar16 = vpmaddwd_avx2(auVar37,auVar36);
    auVar35._16_8_ = local_25e0;
    auVar35._0_16_ = auVar13;
    auVar35._24_8_ = uStackY_25d8;
    auVar34._16_8_ = uStack_c50;
    auVar34._0_16_ = auVar4;
    auVar34._24_8_ = uStack_c48;
    auVar17 = vpmaddwd_avx2(auVar35,auVar34);
    auVar14 = vpaddd_avx2(auVar14,auVar15);
    auVar15 = vpaddd_avx2(auVar16,auVar17);
    auVar33._16_8_ = local_25c0;
    auVar33._0_16_ = auVar56;
    auVar33._24_8_ = uStackY_25b8;
    auVar16._16_8_ = uStack_c90;
    auVar16._0_16_ = auVar5;
    auVar16._24_8_ = uStack_c88;
    auVar16 = vpmaddwd_avx2(auVar33,auVar16);
    auVar32._16_8_ = local_25e0;
    auVar32._0_16_ = auVar13;
    auVar32._24_8_ = uStackY_25d8;
    auVar17._16_8_ = uStack_cd0;
    auVar17._0_16_ = auVar6;
    auVar17._24_8_ = uStack_cc8;
    auVar17 = vpmaddwd_avx2(auVar32,auVar17);
    auVar31._16_8_ = local_25c0;
    auVar31._0_16_ = auVar56;
    auVar31._24_8_ = uStackY_25b8;
    auVar30._16_8_ = uStack_d10;
    auVar30._0_16_ = auVar7;
    auVar30._24_8_ = uStack_d08;
    auVar18 = vpmaddwd_avx2(auVar31,auVar30);
    auVar29._16_8_ = local_25e0;
    auVar29._0_16_ = auVar13;
    auVar29._24_8_ = uStackY_25d8;
    auVar28._16_8_ = uStack_d50;
    auVar28._0_16_ = auVar8;
    auVar28._24_8_ = uStack_d48;
    auVar19 = vpmaddwd_avx2(auVar29,auVar28);
    auVar16 = vpaddd_avx2(auVar16,auVar17);
    auVar17 = vpaddd_avx2(auVar18,auVar19);
    uVar26 = *(undefined8 *)((long)local_2d00 + (long)local_2904 * 2);
    uVar27 = *(undefined8 *)((long)local_2d00 + (long)local_2904 * 2 + 8);
    auVar57._8_8_ = uVar27;
    auVar57._0_8_ = uVar26;
    auVar56 = vpunpcklwd_avx(auVar57,*(undefined1 (*) [16])(local_2c80 + (long)local_2904 * 2));
    auVar58._8_8_ = uVar27;
    auVar58._0_8_ = uVar26;
    auVar57 = vpunpckhwd_avx(auVar58,*(undefined1 (*) [16])(local_2c80 + (long)local_2904 * 2));
    auVar13 = vpunpcklwd_avx(*(undefined1 (*) [16])(local_2cc0 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2c40 + (long)local_2904 * 2));
    auVar58 = vpunpckhwd_avx(*(undefined1 (*) [16])(local_2cc0 + (long)local_2904 * 2),
                             *(undefined1 (*) [16])(local_2c40 + (long)local_2904 * 2));
    local_25c0 = auVar57._0_8_;
    uStackY_25b8 = auVar57._8_8_;
    local_25e0 = auVar58._0_8_;
    uStackY_25d8 = auVar58._8_8_;
    auVar25._16_8_ = local_25c0;
    auVar25._0_16_ = auVar56;
    auVar25._24_8_ = uStackY_25b8;
    auVar19._16_8_ = uStack_d90;
    auVar19._0_16_ = auVar9;
    auVar19._24_8_ = uStack_d88;
    auVar19 = vpmaddwd_avx2(auVar25,auVar19);
    auVar24._16_8_ = local_25c0;
    auVar24._0_16_ = auVar56;
    auVar24._24_8_ = uStackY_25b8;
    auVar20._16_8_ = uStack_dd0;
    auVar20._0_16_ = auVar10;
    auVar20._24_8_ = uStack_dc8;
    auVar20 = vpmaddwd_avx2(auVar24,auVar20);
    auVar23._16_8_ = local_25e0;
    auVar23._0_16_ = auVar13;
    auVar23._24_8_ = uStackY_25d8;
    auVar21._16_8_ = uStack_e10;
    auVar21._0_16_ = auVar11;
    auVar21._24_8_ = uStack_e08;
    auVar21 = vpmaddwd_avx2(auVar23,auVar21);
    auVar22._16_8_ = local_25e0;
    auVar22._0_16_ = auVar13;
    auVar22._24_8_ = uStackY_25d8;
    auVar18._16_8_ = uStack_e50;
    auVar18._0_16_ = auVar12;
    auVar18._24_8_ = uStack_e48;
    auVar22 = vpmaddwd_avx2(auVar22,auVar18);
    auVar18 = vpaddd_avx2(auVar19,auVar21);
    auVar21 = vpsubd_avx2(auVar19,auVar21);
    auVar19 = vpaddd_avx2(auVar20,auVar22);
    auVar22 = vpsubd_avx2(auVar20,auVar22);
    auVar43._16_8_ = uStack_e90;
    auVar43._0_16_ = auVar55;
    auVar43._24_8_ = uStack_e88;
    auVar18 = vpaddd_avx2(auVar18,auVar43);
    auVar42._16_8_ = uStack_e90;
    auVar42._0_16_ = auVar55;
    auVar42._24_8_ = uStack_e88;
    auVar20 = vpaddd_avx2(auVar21,auVar42);
    auVar41._16_8_ = uStack_e90;
    auVar41._0_16_ = auVar55;
    auVar41._24_8_ = uStack_e88;
    auVar19 = vpaddd_avx2(auVar19,auVar41);
    auVar40._16_8_ = uStack_e90;
    auVar40._0_16_ = auVar55;
    auVar40._24_8_ = uStack_e88;
    auVar21 = vpaddd_avx2(auVar22,auVar40);
    auVar22 = vpaddd_avx2(auVar18,auVar14);
    auVar18 = vpsubd_avx2(auVar18,auVar14);
    auVar14 = vpaddd_avx2(auVar19,auVar15);
    auVar23 = vpsubd_avx2(auVar19,auVar15);
    auVar15 = vpaddd_avx2(auVar21,auVar16);
    auVar24 = vpsubd_avx2(auVar21,auVar16);
    auVar16 = vpaddd_avx2(auVar20,auVar17);
    auVar25 = vpsubd_avx2(auVar20,auVar17);
    auVar17 = vpsrad_avx2(auVar22,ZEXT416(uVar54));
    auVar18 = vpsrad_avx2(auVar18,ZEXT416(uVar54));
    auVar19 = vpsrad_avx2(auVar14,ZEXT416(uVar54));
    auVar20 = vpsrad_avx2(auVar23,ZEXT416(uVar54));
    auVar21 = vpsrad_avx2(auVar15,ZEXT416(uVar54));
    auVar15 = vpsrad_avx2(auVar24,ZEXT416(uVar54));
    auVar22 = vpsrad_avx2(auVar16,ZEXT416(uVar54));
    auVar14 = vpsrad_avx2(auVar25,ZEXT416(uVar54));
    auVar14 = vpackssdw_avx2(auVar17,auVar14);
    auVar15 = vpackssdw_avx2(auVar19,auVar15);
    auVar16 = vpackssdw_avx2(auVar21,auVar20);
    auVar17 = vpackssdw_avx2(auVar22,auVar18);
    auVar18 = vpunpcklwd_avx2(auVar14,auVar16);
    auVar14 = vpunpckhwd_avx2(auVar14,auVar16);
    auVar16 = vpunpcklwd_avx2(auVar15,auVar17);
    auVar15 = vpunpckhwd_avx2(auVar15,auVar17);
    auVar17 = vpunpcklwd_avx2(auVar18,auVar16);
    auVar16 = vpunpckhwd_avx2(auVar18,auVar16);
    auVar18 = vpunpcklwd_avx2(auVar14,auVar15);
    auVar14 = vpunpckhwd_avx2(auVar14,auVar15);
    auVar19 = vpunpcklqdq_avx2(auVar17,auVar18);
    auVar15 = vpunpckhqdq_avx2(auVar17,auVar18);
    auVar17 = vpunpcklqdq_avx2(auVar16,auVar14);
    auVar14 = vpunpckhqdq_avx2(auVar16,auVar14);
    auVar16 = vperm2i128_avx2(auVar19,auVar15,0x20);
    auVar18 = vperm2i128_avx2(auVar19,auVar15,0x31);
    auVar20 = vperm2i128_avx2(auVar17,auVar14,0x20);
    auVar21 = vperm2i128_avx2(auVar17,auVar14,0x31);
    if (local_2bf4 != 0xf) {
      uVar53 = (short)(1 << (local_239c & 0x1f)) - 1;
      auVar57 = vpinsrw_avx(ZEXT216(uVar53),(uint)uVar53,1);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,2);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,3);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,4);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,5);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,6);
      auVar57 = vpinsrw_avx(auVar57,(uint)uVar53,7);
      auVar58 = vpinsrw_avx(ZEXT216(uVar53),(uint)uVar53,1);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,2);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,3);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,4);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,5);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,6);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,7);
      uStack_b10 = auVar58._0_8_;
      uStack_b08 = auVar58._8_8_;
      uVar53 = -(short)(1 << (local_239c & 0x1f));
      auVar58 = vpinsrw_avx(ZEXT216(uVar53),(uint)uVar53,1);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,2);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,3);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,4);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,5);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,6);
      auVar58 = vpinsrw_avx(auVar58,(uint)uVar53,7);
      auVar56 = vpinsrw_avx(ZEXT216(uVar53),(uint)uVar53,1);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,2);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,3);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,4);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,5);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,6);
      auVar56 = vpinsrw_avx(auVar56,(uint)uVar53,7);
      auVar56 = ZEXT116(0) * auVar58 + ZEXT116(1) * auVar56;
      auVar58 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar58;
      uStack_b50 = auVar58._0_8_;
      uStack_b48 = auVar58._8_8_;
      auVar47._16_8_ = uStack_b10;
      auVar47._0_16_ = auVar57;
      auVar47._24_8_ = uStack_b08;
      auVar19 = vpminsw_avx2(auVar19,auVar47);
      auVar46._16_8_ = uStack_b10;
      auVar46._0_16_ = auVar57;
      auVar46._24_8_ = uStack_b08;
      auVar15 = vpminsw_avx2(auVar15,auVar46);
      auVar45._16_8_ = uStack_b10;
      auVar45._0_16_ = auVar57;
      auVar45._24_8_ = uStack_b08;
      auVar17 = vpminsw_avx2(auVar17,auVar45);
      auVar44._16_8_ = uStack_b10;
      auVar44._0_16_ = auVar57;
      auVar44._24_8_ = uStack_b08;
      auVar14 = vpminsw_avx2(auVar14,auVar44);
      auVar51._16_8_ = uStack_b50;
      auVar51._0_16_ = auVar56;
      auVar51._24_8_ = uStack_b48;
      vpmaxsw_avx2(auVar19,auVar51);
      auVar50._16_8_ = uStack_b50;
      auVar50._0_16_ = auVar56;
      auVar50._24_8_ = uStack_b48;
      vpmaxsw_avx2(auVar15,auVar50);
      auVar49._16_8_ = uStack_b50;
      auVar49._0_16_ = auVar56;
      auVar49._24_8_ = uStack_b48;
      vpmaxsw_avx2(auVar17,auVar49);
      auVar48._16_8_ = uStack_b50;
      auVar48._0_16_ = auVar56;
      auVar48._24_8_ = uStack_b48;
      vpmaxsw_avx2(auVar14,auVar48);
    }
    local_2800 = auVar16._0_8_;
    uStackY_27f8 = auVar16._8_8_;
    uStackY_27f0 = auVar16._16_8_;
    uStackY_27e8 = auVar16._24_8_;
    *local_2390 = local_2800;
    local_2390[1] = uStackY_27f8;
    local_2390[2] = uStackY_27f0;
    local_2390[3] = uStackY_27e8;
    local_2820 = auVar20._0_8_;
    uStackY_2818 = auVar20._8_8_;
    uStackY_2810 = auVar20._16_8_;
    uStackY_2808 = auVar20._24_8_;
    local_2390[4] = local_2820;
    local_2390[5] = uStackY_2818;
    local_2390[6] = uStackY_2810;
    local_2390[7] = uStackY_2808;
    local_2840 = auVar18._0_8_;
    uStackY_2838 = auVar18._8_8_;
    uStackY_2830 = auVar18._16_8_;
    uStackY_2828 = auVar18._24_8_;
    local_2390[8] = local_2840;
    local_2390[9] = uStackY_2838;
    local_2390[10] = uStackY_2830;
    local_2390[0xb] = uStackY_2828;
    local_2860 = auVar21._0_8_;
    uStackY_2858 = auVar21._8_8_;
    uStackY_2850 = auVar21._16_8_;
    uStackY_2848 = auVar21._24_8_;
    local_2390[0xc] = local_2860;
    local_2390[0xd] = uStackY_2858;
    local_2390[0xe] = uStackY_2850;
    local_2390[0xf] = uStackY_2848;
    local_2390 = local_2390 + 0x10;
  }
  return;
}

Assistant:

void itrans_dct2_h16_w8_avx2(s16 *src, s16 *dst, int bit_depth)
{
    ALIGNED_32(s16 tmp[16 * 8]);
    dct2_butterfly_h16_avx2(src, 8, tmp, 8, 5, MAX_TX_DYNAMIC_RANGE);
    dct2_butterfly_h8_avx2(tmp, 16, dst, 16, 20 - bit_depth, bit_depth);
}